

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cabal.c
# Opt level: O1

void spell_piety(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  uint uVar2;
  AFFECT_DATA af;
  AFFECT_DATA AStack_88;
  
  bVar1 = is_npc(ch);
  if (!bVar1) {
    bVar1 = is_affected(ch,(int)gsn_piety);
    if (bVar1) {
      send_to_char("Your righteous wrath already infuses you with vigor.\n\r",ch);
      return;
    }
    init_affect(&AStack_88);
    AStack_88.where = 0;
    AStack_88.type = gsn_piety;
    AStack_88.level = (short)level;
    AStack_88.aftype = 2;
    AStack_88.location = 0x11;
    uVar2 = level + 3;
    if (-1 < level) {
      uVar2 = level;
    }
    AStack_88.modifier = (short)(uVar2 >> 2);
    AStack_88.duration =
         (short)(uint)((ulong)((long)level * 0x66666667) >> 0x21) - (short)(level >> 0x1f);
    affect_to_char(ch,&AStack_88);
    act("Your righteous wrath at the impure surges through you.",ch,(void *)0x0,(void *)0x0,3);
    act("$n stands taller as $s righteous wrath infuses $m.",ch,(void *)0x0,(void *)0x0,0);
  }
  return;
}

Assistant:

void spell_piety(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	char buf[MSL];

	if (is_npc(ch))
		return;

	if (is_affected(ch, gsn_piety))
	{
		send_to_char("Your righteous wrath already infuses you with vigor.\n\r", ch);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_piety;
	af.level = level;
	af.aftype = AFT_POWER;
	af.location = APPLY_AC;
	af.modifier = level / 4;
	af.duration = level / 5;
	affect_to_char(ch, &af);

	act("Your righteous wrath at the impure surges through you.", ch, 0, 0, TO_CHAR);
	act("$n stands taller as $s righteous wrath infuses $m.", ch, 0, 0, TO_ROOM);
}